

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void iterator_manual_wal_flush(void)

{
  fdb_status fVar1;
  char *__format;
  fdb_iterator *it;
  fdb_doc *local_1b8;
  fdb_kvs_handle *db2;
  uchar start_key2 [11];
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  uchar start_key1 [11];
  uchar key1 [15];
  uchar key2 [17];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  builtin_memcpy(key1,"\b\x05>>4201-",10);
  key1[10] = '\x06';
  key1[0xb] = '1';
  key1[0xc] = '\0';
  key1[0xd] = '\0';
  key1[0xe] = '\0';
  builtin_memcpy(key2,"\b\x05>>42011-",0xb);
  builtin_memcpy(key2 + 0xb,"\x0612",4);
  key2[0xf] = '\0';
  key2[0x10] = '\0';
  builtin_memcpy(start_key1,"\b\x05>>41999-",0xb);
  builtin_memcpy(start_key2,"\b\x05>>4345\n\x14",0xb);
  local_1b8 = (fdb_doc *)0x0;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_open(&dbfile,"./iterator_test1",&fconfig);
  fdb_kvs_open(dbfile,&db,"db1",&kvs_config);
  fdb_kvs_open(dbfile,&db2,"db2",&kvs_config);
  fdb_set_kv(db,key1,0xf,(void *)0x0,0);
  fdb_set_kv(db,key2,0x11,(void *)0x0,0);
  fdb_commit(dbfile,'\0');
  fVar1 = fdb_iterator_init(db,&it,start_key1,0xb,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xd8b);
    iterator_manual_wal_flush()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xd8b,"void iterator_manual_wal_flush()");
  }
  do {
    fVar1 = fdb_iterator_get(it,&local_1b8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xd8e);
      iterator_manual_wal_flush()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xd8e,"void iterator_manual_wal_flush()");
    }
    fdb_doc_free(local_1b8);
    local_1b8 = (fdb_doc *)0x0;
    fVar1 = fdb_iterator_next(it);
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(it);
  fVar1 = fdb_iterator_init(db,&it,start_key2,0xb,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xd97);
    iterator_manual_wal_flush()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xd97,"void iterator_manual_wal_flush()");
  }
  fVar1 = fdb_iterator_get(it,&local_1b8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xd99);
    iterator_manual_wal_flush()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xd99,"void iterator_manual_wal_flush()");
  }
  fdb_iterator_close(it);
  fdb_set_kv(db2,key1,0xf,(void *)0x0,0);
  fdb_set_kv(db2,key2,0x11,(void *)0x0,0);
  fdb_commit(dbfile,'\x01');
  fVar1 = fdb_iterator_init(db2,&it,start_key1,0xb,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xda5);
    iterator_manual_wal_flush()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xda5,"void iterator_manual_wal_flush()");
  }
  do {
    fVar1 = fdb_iterator_get(it,&local_1b8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xda8);
      iterator_manual_wal_flush()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xda8,"void iterator_manual_wal_flush()");
    }
    fdb_doc_free(local_1b8);
    local_1b8 = (fdb_doc *)0x0;
    fVar1 = fdb_iterator_next(it);
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(it);
  fVar1 = fdb_iterator_init(db,&it,start_key2,0xb,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xdb1);
    iterator_manual_wal_flush()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xdb1,"void iterator_manual_wal_flush()");
  }
  fVar1 = fdb_iterator_get(it,&local_1b8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xdb3);
    iterator_manual_wal_flush()::__test_pass = 1;
    __assert_fail("status != FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xdb3,"void iterator_manual_wal_flush()");
  }
  fdb_iterator_close(it);
  fVar1 = fdb_iterator_init(db2,&it,(void *)0x0,0,start_key1,0xb,0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_iterator_seek(it,start_key1,0xb,'\x01');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xdbb);
      iterator_manual_wal_flush()::__test_pass = 1;
      __assert_fail("status != FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdbb,"void iterator_manual_wal_flush()");
    }
    fdb_iterator_close(it);
    fVar1 = fdb_iterator_init(db,&it,(void *)0x0,0,start_key2,0xb,0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xdc1);
      iterator_manual_wal_flush()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdc1,"void iterator_manual_wal_flush()");
    }
    fVar1 = fdb_iterator_seek(it,start_key2,0xb,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xdc3);
      iterator_manual_wal_flush()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdc3,"void iterator_manual_wal_flush()");
    }
    fVar1 = fdb_iterator_get(it,&local_1b8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      do {
        fdb_doc_free(local_1b8);
        local_1b8 = (fdb_doc *)0x0;
        fVar1 = fdb_iterator_prev(it);
        if (fVar1 == FDB_RESULT_ITERATOR_FAIL) {
          fdb_iterator_close(it);
          fdb_close(dbfile);
          fdb_shutdown();
          memleak_end();
          __format = "%s PASSED\n";
          if (iterator_manual_wal_flush()::__test_pass != '\0') {
            __format = "%s FAILED\n";
          }
          fprintf(_stderr,__format,"iterator manual wal flush");
          return;
        }
        fVar1 = fdb_iterator_get(it,&local_1b8);
      } while (fVar1 == FDB_RESULT_SUCCESS);
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0xdca);
      iterator_manual_wal_flush()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xdca,"void iterator_manual_wal_flush()");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xdc5);
    iterator_manual_wal_flush()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xdc5,"void iterator_manual_wal_flush()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0xdb9);
  iterator_manual_wal_flush()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xdb9,"void iterator_manual_wal_flush()");
}

Assistant:

void iterator_manual_wal_flush()
{
    TEST_INIT();
    memleak_start();

    int r;
    unsigned char key1[] =       { 8,  5, 62, 62, 52, 50, 48, 49,
                                  45,  0,  6, 49,  0,  0,  0};
    unsigned char key2[] =       { 8,  5, 62, 62, 52, 50, 48, 49,
                                  49, 45,  0,  6, 49, 50,  0,  0,
                                   0};
    unsigned char start_key1[] = { 8,  5, 62, 62, 52, 49, 57, 57,
                                  57, 45,  0};
    unsigned char start_key2[] = { 8,  5, 62, 62, 52, 51, 52, 53,
                                  10, 20,  0};
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *it;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db1", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);

    fdb_set_kv(db, key1, sizeof(key1), NULL, 0);
    fdb_set_kv(db, key2, sizeof(key2), NULL, 0);

    // normal commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db, &it, start_key1, sizeof(start_key1),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, start_key2, sizeof(start_key2),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    fdb_set_kv(db2, key1, sizeof(key1), NULL, 0);
    fdb_set_kv(db2, key2, sizeof(key2), NULL, 0);

    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db2, &it, start_key1, sizeof(start_key1),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, start_key2, sizeof(start_key2),
                               NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    // start_key's skipped prefix is smaller than the common prefix
    status = fdb_iterator_init(db2, &it, NULL, 0,
                               start_key1, sizeof(start_key1), FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_seek(it, start_key1, sizeof(start_key1), FDB_ITR_SEEK_LOWER);
    TEST_CHK(status != FDB_RESULT_SUCCESS);
    fdb_iterator_close(it);

    // start_key's skipped prefix is gerater than the common prefix
    status = fdb_iterator_init(db, &it, NULL, 0,
                               start_key2, sizeof(start_key2), FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_seek(it, start_key2, sizeof(start_key2), FDB_ITR_SEEK_LOWER);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(it, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;
    while (fdb_iterator_prev(it) != FDB_RESULT_ITERATOR_FAIL) {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }
    fdb_iterator_close(it);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("iterator manual wal flush");
}